

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O0

TransactionContext * __thiscall cfd::Psbt::GetTransactionContext(Psbt *this)

{
  Psbt *in_RSI;
  TransactionContext *in_RDI;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxo_list;
  TransactionContext *tx;
  NetType in_stack_00000464;
  Psbt *in_stack_00000468;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_000005e8;
  TransactionContext *in_stack_000005f0;
  string *in_stack_ffffffffffffff38;
  TransactionContext *this_00;
  Transaction local_78;
  string local_38;
  byte local_11;
  
  local_11 = 0;
  this_00 = in_RDI;
  core::Psbt::GetTransaction(&local_78,in_RSI);
  core::AbstractTransaction::GetHex_abi_cxx11_(&local_38,&local_78.super_AbstractTransaction);
  TransactionContext::TransactionContext(this_00,in_stack_ffffffffffffff38);
  std::__cxx11::string::~string((string *)&local_38);
  core::Transaction::~Transaction(&this_00->super_Transaction);
  GetUtxoDataAll(in_stack_00000468,in_stack_00000464);
  TransactionContext::CollectInputUtxo(in_stack_000005f0,in_stack_000005e8);
  local_11 = 1;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_RSI);
  if ((local_11 & 1) == 0) {
    TransactionContext::~TransactionContext(this_00);
  }
  return in_RDI;
}

Assistant:

TransactionContext Psbt::GetTransactionContext() const {
  TransactionContext tx(GetTransaction().GetHex());
  std::vector<UtxoData> utxo_list = GetUtxoDataAll();
  tx.CollectInputUtxo(utxo_list);
  return tx;
}